

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_WriteVarint32_Test::TestBody
          (VarintCasesWithSizes_WriteVarint32_Test *this)

{
  size_t *lhs;
  bool bVar1;
  uint uVar2;
  ParamType *pPVar3;
  ParamType *pPVar4;
  int64_t iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint8_t *ptr;
  uint uVar7;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr;
  void *data;
  CodedOutputStream coded_output;
  ArrayOutputStream output;
  AssertHelper local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  AssertHelper local_98;
  undefined1 local_90 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80 [2];
  ArrayOutputStream *local_60;
  undefined2 local_58;
  bool local_56;
  bool local_55;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  int64_t local_48;
  ArrayOutputStream local_40;
  
  pPVar3 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  pPVar4 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  if (*(int *)((long)&(pPVar3->
                      super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>
                      ).
                      super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>
                      ._M_head_impl.value + 4) == 0) {
    ArrayOutputStream::ArrayOutputStream
              (&local_40,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
               (pPVar4->
               super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>)
               .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
    local_56 = (bool)(CodedOutputStream::default_serialization_deterministic_ & 1);
    local_58._0_1_ = false;
    local_58._1_1_ = false;
    local_55 = false;
    local_90 = (undefined1  [8])local_80;
    local_88 = local_80;
    local_60 = &local_40;
    local_50 = local_80;
    local_48 = ArrayOutputStream::ByteCount(&local_40);
    bVar1 = ArrayOutputStream::Next(&local_40,(void **)local_b8,(int *)&local_d0);
    if (bVar1 && 0 < (int)(uint)local_d0.data_) {
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_b8 + -0x10);
      if ((uint)local_d0.data_ < 0x11) {
        paVar6 = local_80;
      }
      local_90 = (undefined1  [8])(paVar6->_M_local_buf + (uint)local_d0.data_);
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b8;
      local_50 = local_80;
      if ((uint)local_d0.data_ >= 0x11) {
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b8;
      }
    }
    uVar2 = (uint)(pPVar3->
                  super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>
                  ).
                  super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>
                  ._M_head_impl.value;
    paVar6 = local_50;
    if ((ulong)local_90 <= local_50) {
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)EpsCopyOutputStream::EnsureSpaceFallback
                            ((EpsCopyOutputStream *)local_90,
                             (uint8_t *)&local_50->_M_allocated_capacity);
    }
    uVar7 = uVar2;
    if (0x7f < uVar2) {
      do {
        paVar6->_M_local_buf[0] = (byte)uVar7 | 0x80;
        uVar2 = uVar7 >> 7;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar6 + 1);
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
    }
    paVar6->_M_local_buf[0] = (byte)uVar2;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar6 + 1);
    bVar1 = CodedOutputStream::HadError((CodedOutputStream *)local_90);
    local_d0.data_._0_4_ = CONCAT31(local_d0.data_._1_3_,!bVar1);
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)&local_d0,
                 (AssertionResult *)"coded_output.HadError()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0x112,(char *)local_b8);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
      }
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
      if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,local_c8);
      }
    }
    iVar5 = EpsCopyOutputStream::ByteCount((EpsCopyOutputStream *)local_90,(uint8_t *)local_50);
    lhs = &(pPVar3->
           super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
           super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
           _M_head_impl.size;
    local_d0.data_._0_4_ = (int)iVar5 - (int)local_48;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_b8,"kVarintCases_case.size","coded_output.ByteCount()",lhs,
               (int *)&local_d0);
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0x114,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if ((long *)CONCAT44(local_d0.data_._4_4_,(uint)local_d0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,(uint)local_d0.data_) + 8))();
      }
    }
    if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0,local_b0);
    }
    CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_90);
    local_b8 = (undefined1  [8])ArrayOutputStream::ByteCount(&local_40);
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)local_90,"kVarintCases_case.size","output.ByteCount()",lhs,
               (long *)local_b8);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_88 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (char *)local_88->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0x117,pcVar8);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if (local_88 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    }
    local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
    local_d0.data_._0_4_ =
         memcmp(&io::(anonymous_namespace)::CodedStreamTest::buffer_,
                &(pPVar3->
                 super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>
                 ).
                 super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>
                ,*lhs);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"0",
               "memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size)",(int *)local_b8,
               (int *)&local_d0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_88 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (char *)local_88->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0x119,pcVar8);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if (local_88 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    }
  }
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint32) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  if (kVarintCases_case.value > uint64_t{0x00000000FFFFFFFFu}) {
    // Skip this test for the 64-bit values.
    return;
  }

  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint32(static_cast<uint32_t>(kVarintCases_case.value));
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}